

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  
  printOpenHeader(this,_name);
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001ea030 = 0x2e2e2e2e2e2e2e;
    uRam00000000001ea037._0_1_ = '.';
    uRam00000000001ea037._1_1_ = '.';
    uRam00000000001ea037._2_1_ = '.';
    uRam00000000001ea037._3_1_ = '.';
    uRam00000000001ea037._4_1_ = '.';
    uRam00000000001ea037._5_1_ = '.';
    uRam00000000001ea037._6_1_ = '.';
    uRam00000000001ea037._7_1_ = '.';
    DAT_001ea020 = '.';
    DAT_001ea020_1._0_1_ = '.';
    DAT_001ea020_1._1_1_ = '.';
    DAT_001ea020_1._2_1_ = '.';
    DAT_001ea020_1._3_1_ = '.';
    DAT_001ea020_1._4_1_ = '.';
    DAT_001ea020_1._5_1_ = '.';
    DAT_001ea020_1._6_1_ = '.';
    uRam00000000001ea028 = 0x2e2e2e2e2e2e2e;
    DAT_001ea02f = 0x2e;
    DAT_001ea010 = '.';
    DAT_001ea010_1._0_1_ = '.';
    DAT_001ea010_1._1_1_ = '.';
    DAT_001ea010_1._2_1_ = '.';
    DAT_001ea010_1._3_1_ = '.';
    DAT_001ea010_1._4_1_ = '.';
    DAT_001ea010_1._5_1_ = '.';
    DAT_001ea010_1._6_1_ = '.';
    uRam00000000001ea018._0_1_ = '.';
    uRam00000000001ea018._1_1_ = '.';
    uRam00000000001ea018._2_1_ = '.';
    uRam00000000001ea018._3_1_ = '.';
    uRam00000000001ea018._4_1_ = '.';
    uRam00000000001ea018._5_1_ = '.';
    uRam00000000001ea018._6_1_ = '.';
    uRam00000000001ea018._7_1_ = '.';
    DAT_001ea000 = '.';
    DAT_001ea000_1._0_1_ = '.';
    DAT_001ea000_1._1_1_ = '.';
    DAT_001ea000_1._2_1_ = '.';
    DAT_001ea000_1._3_1_ = '.';
    DAT_001ea000_1._4_1_ = '.';
    DAT_001ea000_1._5_1_ = '.';
    DAT_001ea000_1._6_1_ = '.';
    uRam00000000001ea008._0_1_ = '.';
    uRam00000000001ea008._1_1_ = '.';
    uRam00000000001ea008._2_1_ = '.';
    uRam00000000001ea008._3_1_ = '.';
    uRam00000000001ea008._4_1_ = '.';
    uRam00000000001ea008._5_1_ = '.';
    uRam00000000001ea008._6_1_ = '.';
    uRam00000000001ea008._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001e9ff8._0_1_ = '.';
    uRam00000000001e9ff8._1_1_ = '.';
    uRam00000000001e9ff8._2_1_ = '.';
    uRam00000000001e9ff8._3_1_ = '.';
    uRam00000000001e9ff8._4_1_ = '.';
    uRam00000000001e9ff8._5_1_ = '.';
    uRam00000000001e9ff8._6_1_ = '.';
    uRam00000000001e9ff8._7_1_ = '.';
    DAT_001ea03f = 0;
  }
  poVar1 = std::operator<<((this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream,
                           &getLineOfChars<(char)46>()::line);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}